

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O0

char * xSAT_FileRead(FILE *pFile)

{
  int iVar1;
  long lVar2;
  char *__ptr;
  int RetValue;
  char *pBuffer;
  int nFileSize;
  FILE *pFile_local;
  
  fseek((FILE *)pFile,0,2);
  lVar2 = ftell((FILE *)pFile);
  iVar1 = (int)lVar2;
  rewind((FILE *)pFile);
  __ptr = (char *)malloc((long)(iVar1 + 3));
  fread(__ptr,(long)iVar1,1,(FILE *)pFile);
  __ptr[iVar1] = '\n';
  __ptr[iVar1 + 1] = '\0';
  return __ptr;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Read the file into the internal buffer.]

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
char * xSAT_FileRead( FILE * pFile )
{
    int nFileSize;
    char * pBuffer;
    int RetValue;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );
    nFileSize = ftell( pFile );
    // move the file current reading position to the beginning
    rewind( pFile );
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nFileSize + 3 );
    RetValue = fread( pBuffer, nFileSize, 1, pFile );
    // terminate the string with '\0'
    pBuffer[ nFileSize + 0] = '\n';
    pBuffer[ nFileSize + 1] = '\0';
    return pBuffer;
}